

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::cp_mhl(CPU *this)

{
  ushort uVar1;
  int iVar2;
  
  uVar1._0_1_ = this->regs->h;
  uVar1._1_1_ = this->regs->l;
  iVar2 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
  cp_r8(this,(uint8_t)iVar2);
  return 2;
}

Assistant:

int CPU::cp_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    cp_r8(mmu.read_byte(addr));
    return 2;
}